

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O0

void calc_mean_and_sd_<float,int,long_double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
               int *Xc_indptr,double *x_sd,double *x_mean)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  bool bVar6;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __x;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  long in_stack_00000008;
  double *in_stack_00000010;
  double *in_stack_00000018;
  size_t *row;
  longdouble m_prev;
  longdouble s;
  longdouble m;
  size_t added;
  size_t cnt;
  size_t *ptr_st;
  size_t ind_end_col;
  size_t curr_pos;
  size_t end_col;
  size_t st_col;
  undefined2 in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef2;
  unsigned_long *in_stack_fffffffffffffef8;
  undefined2 in_stack_ffffffffffffff00;
  undefined6 in_stack_ffffffffffffff02;
  byte local_ea;
  ulong *local_b0;
  longdouble local_a8;
  longdouble local_98;
  longdouble local_88;
  ulong local_70;
  ulong local_68;
  long local_48;
  
  if (*(int *)(in_stack_00000008 + in_RCX * 4) == *(int *)(in_stack_00000008 + 4 + in_RCX * 4)) {
    *in_stack_00000010 = 0.0;
    *in_stack_00000018 = 0.0;
  }
  else {
    local_48 = (long)*(int *)(in_stack_00000008 + in_RCX * 4);
    lVar4 = (long)(*(int *)(in_stack_00000008 + 4 + in_RCX * 4) + -1);
    iVar1 = *(int *)(in_R9 + lVar4 * 4);
    local_b0 = std::lower_bound<unsigned_long*,unsigned_long>
                         ((unsigned_long *)
                          CONCAT62(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00),
                          in_stack_fffffffffffffef8,
                          (unsigned_long *)
                          CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0));
    local_68 = (in_RDX - in_RSI) + 1;
    local_70 = 0;
    local_a8 = (longdouble)0;
    __x = extraout_XMM0_Qa;
    local_98 = local_a8;
    local_88 = local_a8;
    while( true ) {
      bVar6 = false;
      if ((local_b0 != (ulong *)(in_RDI + in_RDX * 8 + 8)) && (bVar6 = false, local_48 != lVar4 + 1)
         ) {
        bVar6 = *local_b0 <= (ulong)(long)iVar1;
      }
      if (!bVar6) break;
      if (*(int *)(in_R9 + local_48 * 4) == (int)*local_b0) {
        uVar2 = std::isnan((double)(ulong)*(uint *)(in_R8 + local_48 * 4));
        local_ea = 1;
        lVar7 = in_ST0;
        __x = extraout_XMM0_Qa_00;
        if ((uVar2 & 1) == 0) {
          iVar3 = std::isinf((double)(ulong)*(uint *)(in_R8 + local_48 * 4));
          local_ea = (byte)iVar3;
          lVar7 = in_ST0;
          __x = extraout_XMM0_Qa_01;
        }
        if ((local_ea & 1) == 0) {
          if (local_70 == 0) {
            local_a8 = (longdouble)*(float *)(in_R8 + local_48 * 4);
          }
          local_70 = local_70 + 1;
          local_88 = local_88 +
                     ((longdouble)*(float *)(in_R8 + local_48 * 4) - local_88) /
                     ((longdouble)(float)(&DAT_006c0110)[(long)local_70 < 0] +
                     (longdouble)(long)local_70);
          in_stack_fffffffffffffef8 = SUB108(local_98,0);
          in_stack_ffffffffffffff00 = (undefined2)((unkuint10)local_98 >> 0x40);
          in_stack_fffffffffffffef0 =
               (undefined2)
               ((unkuint10)((longdouble)*(float *)(in_R8 + local_48 * 4) - local_a8) >> 0x40);
          lVar8 = in_ST4;
          __x = std::fma(__x,in_XMM1_Qa,in_XMM2_Qa);
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = lVar8;
          local_a8 = local_88;
          local_98 = lVar7;
        }
        else {
          local_68 = local_68 - 1;
          in_ST0 = lVar7;
        }
        if ((local_b0 == (ulong *)(in_RDI + in_RDX * 8)) || (local_48 == lVar4)) break;
        local_b0 = local_b0 + 1;
        piVar5 = std::lower_bound<int*,unsigned_long>
                           ((int *)CONCAT62(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00),
                            (int *)in_stack_fffffffffffffef8,
                            (unsigned_long *)
                            CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0));
        local_48 = (long)piVar5 - in_R9 >> 2;
        __x = extraout_XMM0_Qa_02;
      }
      else if ((int)*local_b0 < *(int *)(in_R9 + local_48 * 4)) {
        local_b0 = std::lower_bound<unsigned_long*,int>
                             ((unsigned_long *)
                              CONCAT62(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00),
                              in_stack_fffffffffffffef8,
                              (int *)CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0));
        __x = extraout_XMM0_Qa_03;
      }
      else {
        piVar5 = std::lower_bound<int*,unsigned_long>
                           ((int *)CONCAT62(in_stack_ffffffffffffff02,in_stack_ffffffffffffff00),
                            (int *)in_stack_fffffffffffffef8,
                            (unsigned_long *)
                            CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0));
        local_48 = (long)piVar5 - in_R9 >> 2;
        __x = extraout_XMM0_Qa_04;
      }
    }
    if (local_70 == 0) {
      *in_stack_00000018 = 0.0;
      *in_stack_00000010 = 0.0;
    }
    else {
      if (local_70 < local_68) {
        local_88 = local_88 *
                   (((longdouble)(float)(&DAT_006c0110)[(long)local_70 < 0] +
                    (longdouble)(long)local_70) /
                   ((longdouble)(float)(&DAT_006c0110)[(long)local_68 < 0] +
                   (longdouble)(long)local_68));
      }
      *in_stack_00000018 = (double)local_88;
      std::sqrt(__x);
      *in_stack_00000010 = (double)in_ST0;
    }
  }
  return;
}

Assistant:

void calc_mean_and_sd_(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                      real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                      double &restrict x_sd, double &restrict x_mean)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    size_t cnt = end - st + 1;
    size_t added = 0;
    real_t m = 0;
    real_t s = 0;
    real_t m_prev = 0;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt--;
            }

            else
            {
                if (added == 0) m_prev = Xc[curr_pos];
                m += (Xc[curr_pos] - m) / (real_t)(++added);
                s  = std::fma(Xc[curr_pos] - m, Xc[curr_pos] - m_prev, s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * ((real_t)added * ((real_t)1 - (real_t)added/(real_t)cnt));
        m *= (real_t)added / (real_t)cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (real_t)cnt);
}